

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service_client_link.cpp
# Opt level: O3

void __thiscall
miniros::ServiceClientLink::onRequestLength
          (ServiceClientLink *this,ConnectionPtr *conn,shared_ptr<unsigned_char[]> *buffer,
          uint32_t size,bool success)

{
  uint __fd;
  undefined3 in_register_00000081;
  undefined1 local_30 [16];
  undefined1 local_20 [16];
  
  if (CONCAT31(in_register_00000081,success) != 0) {
    __fd = *(uint *)(buffer->super___shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>)._M_ptr
    ;
    if (__fd < 0x3b9aca01) {
      local_30._8_8_ = 0;
      local_20._8_8_ =
           std::
           _Function_handler<void_(const_std::shared_ptr<miniros::Connection>_&,_const_std::shared_ptr<unsigned_char[]>_&,_unsigned_int,_bool),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/service_client_link.cpp:227:7)>
           ::_M_invoke;
      local_20._0_8_ =
           std::
           _Function_handler<void_(const_std::shared_ptr<miniros::Connection>_&,_const_std::shared_ptr<unsigned_char[]>_&,_unsigned_int,_bool),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/service_client_link.cpp:227:7)>
           ::_M_manager;
      local_30._0_8_ = this;
      Connection::read((this->connection_).
                       super___shared_ptr<miniros::Connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                       __fd,local_30,0x1fd0e0);
      if ((code *)local_20._0_8_ != (code *)0x0) {
        (*(code *)local_20._0_8_)(local_30,local_30,3);
      }
    }
    else {
      if (console::g_initialized == '\0') {
        console::initialize();
      }
      if (onRequestLength::loc.initialized_ == false) {
        local_30._0_8_ = local_20;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_30,"miniros.service_client_link","");
        console::initializeLogLocation(&onRequestLength::loc,(string *)local_30,Error);
        if ((undefined1 *)local_30._0_8_ != local_20) {
          operator_delete((void *)local_30._0_8_,local_20._0_8_ + 1);
        }
      }
      if (onRequestLength::loc.level_ != Error) {
        onRequestLength();
      }
      if (onRequestLength::loc.logger_enabled_ == true) {
        onRequestLength();
      }
      Connection::drop((conn->super___shared_ptr<miniros::Connection,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr,Destructing);
    }
  }
  return;
}

Assistant:

void ServiceClientLink::onRequestLength(const ConnectionPtr& conn, const std::shared_ptr<uint8_t[]>& buffer, uint32_t size, bool success)
{
  (void)size;
  if (!success)
    return;

  MINIROS_ASSERT(conn == connection_);
  MINIROS_ASSERT(size == 4);

  uint32_t len = *((uint32_t*)buffer.get());

  if (len > 1000000000)
  {
    MINIROS_ERROR("a message of over a gigabyte was " \
                "predicted in tcpros. that seems highly " \
                "unlikely, so I'll assume protocol " \
                "synchronization is lost.");
    conn->drop(Connection::Destructing);
    return;
  }

  connection_->read(len,
      [this](const ConnectionPtr& conn, const std::shared_ptr<uint8_t[]>& buffer, uint32_t size, bool success)
      {
          this->onRequest(conn, buffer, size, success);
      });
}